

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
BasicBuildSystemFrontendDelegate::cycleDetected
          (BasicBuildSystemFrontendDelegate *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items)

{
  vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *in_RDX;
  Twine local_50;
  undefined1 local_38 [8];
  string message;
  vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items_local;
  BasicBuildSystemFrontendDelegate *this_local;
  
  message.field_2._8_8_ = items;
  llbuild::buildsystem::BuildSystemInvocation::formatDetectedCycle_abi_cxx11_
            ((string *)local_38,(BuildSystemInvocation *)items,in_RDX);
  llvm::Twine::Twine(&local_50,(string *)local_38);
  llbuild::buildsystem::BuildSystemFrontendDelegate::error
            (&this->super_BuildSystemFrontendDelegate,&local_50);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

virtual void cycleDetected(const std::vector<core::Rule*>& items) override {
    auto message = BuildSystemInvocation::formatDetectedCycle(items);
    error(message);
  }